

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O0

bool __thiscall
spirv_cross::CompilerMSL::emit_array_copy
          (CompilerMSL *this,char *expr,uint32_t lhs_id,uint32_t rhs_id,StorageClass lhs_storage,
          StorageClass rhs_storage)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  uint32_t uVar4;
  Types TVar5;
  SPIRVariable *pSVar6;
  SPIRType *pSVar7;
  Variant *pVVar8;
  size_t sVar9;
  CompilerError *this_00;
  bool local_149;
  bool local_139;
  string local_138;
  string local_118;
  string local_f8;
  string local_d8;
  char *local_b8;
  char *tag;
  SPIRVariable *pSStack_a8;
  bool is_constant;
  SPIRVariable *var;
  SPIRType *type;
  undefined1 local_68 [8];
  string lhs;
  SPIRVariable *rhs_var;
  SPIRVariable *lhs_var;
  bool rhs_is_array_template;
  bool lhs_is_array_template;
  bool rhs_is_thread_storage;
  bool lhs_is_thread_storage;
  StorageClass rhs_storage_local;
  StorageClass lhs_storage_local;
  uint32_t rhs_id_local;
  uint32_t lhs_id_local;
  char *expr_local;
  CompilerMSL *this_local;
  
  bVar1 = storage_class_array_is_thread(lhs_storage);
  bVar2 = storage_class_array_is_thread(rhs_storage);
  local_139 = bVar1 || lhs_storage == StorageClassWorkgroup;
  local_149 = bVar2 || rhs_storage == StorageClassWorkgroup;
  pSVar6 = Compiler::maybe_get_backing_variable((Compiler *)this,lhs_id);
  if (((pSVar6 == (SPIRVariable *)0x0) || (lhs_storage != StorageBuffer)) ||
     (bVar3 = storage_class_array_is_thread(pSVar6->storage), !bVar3)) {
    if ((pSVar6 != (SPIRVariable *)0x0) && (lhs_storage != Generic)) {
      uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(pSVar6->super_IVariant).field_0xc)
      ;
      pSVar7 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,uVar4);
      bVar3 = Compiler::type_is_block_like((Compiler *)this,pSVar7);
      if (bVar3) {
        local_139 = false;
      }
    }
  }
  else {
    local_139 = true;
  }
  lhs.field_2._8_8_ = Compiler::maybe_get_backing_variable((Compiler *)this,rhs_id);
  if ((((SPIRVariable *)lhs.field_2._8_8_ == (SPIRVariable *)0x0) || (rhs_storage != StorageBuffer))
     || (bVar3 = storage_class_array_is_thread(((SPIRVariable *)lhs.field_2._8_8_)->storage), !bVar3
        )) {
    if ((lhs.field_2._8_8_ != 0) && (rhs_storage != Generic)) {
      uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)(lhs.field_2._8_8_ + 0xc));
      pSVar7 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,uVar4);
      bVar3 = Compiler::type_is_block_like((Compiler *)this,pSVar7);
      if (bVar3) {
        local_149 = false;
      }
    }
  }
  else {
    local_149 = true;
  }
  if (((local_139) && (local_149)) && (bVar3 = using_builtin_array(this), !bVar3)) {
    return false;
  }
  if (pSVar6 != (SPIRVariable *)0x0) {
    uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(pSVar6->super_IVariant).self);
    CompilerGLSL::flush_variable_declaration(&this->super_CompilerGLSL,uVar4);
  }
  ::std::__cxx11::string::string((string *)local_68);
  if (expr == (char *)0x0) {
    CompilerGLSL::to_expression_abi_cxx11_((string *)&type,&this->super_CompilerGLSL,lhs_id,true);
    ::std::__cxx11::string::operator=((string *)local_68,(string *)&type);
    ::std::__cxx11::string::~string((string *)&type);
  }
  else {
    ::std::__cxx11::string::operator=((string *)local_68,expr);
  }
  var = (SPIRVariable *)Compiler::expression_type((Compiler *)this,rhs_id);
  pSStack_a8 = Compiler::maybe_get_backing_variable((Compiler *)this,rhs_id);
  tag._7_1_ = 0;
  pVVar8 = VectorView<spirv_cross::Variant>::operator[]
                     (&(this->super_CompilerGLSL).super_Compiler.ir.ids.
                       super_VectorView<spirv_cross::Variant>,(ulong)rhs_id);
  TVar5 = Variant::get_type(pVVar8);
  if (TVar5 == TypeConstant) {
    tag._7_1_ = 1;
  }
  else {
    if (((pSStack_a8 != (SPIRVariable *)0x0) && ((pSStack_a8->remapped_variable & 1U) != 0)) &&
       ((pSStack_a8->statically_assigned & 1U) != 0)) {
      uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)&pSStack_a8->static_expression);
      pVVar8 = VectorView<spirv_cross::Variant>::operator[]
                         (&(this->super_CompilerGLSL).super_Compiler.ir.ids.
                           super_VectorView<spirv_cross::Variant>,(ulong)uVar4);
      TVar5 = Variant::get_type(pVVar8);
      if (TVar5 == TypeConstant) {
        tag._7_1_ = 1;
        goto LAB_0036ef2f;
      }
    }
    if ((rhs_storage == StorageClassUniform) || (rhs_storage == StorageClassUniformConstant)) {
      tag._7_1_ = 1;
    }
  }
LAB_0036ef2f:
  sVar9 = VectorView<unsigned_int>::size(&(var->dereference_chain).super_VectorView<unsigned_int>);
  add_spv_func_and_recompile(this,SPVFuncImplArrayCopyMultidim - (sVar9 < 2));
  local_b8 = (char *)0x0;
  if ((bVar1) && ((tag._7_1_ & 1) != 0)) {
    local_b8 = "FromConstantToStack";
  }
  else if ((lhs_storage == StorageClassWorkgroup) && ((tag._7_1_ & 1) != 0)) {
    local_b8 = "FromConstantToThreadGroup";
  }
  else if ((bVar1) && (bVar2)) {
    local_b8 = "FromStackToStack";
  }
  else if ((lhs_storage == StorageClassWorkgroup) && (bVar2)) {
    local_b8 = "FromStackToThreadGroup";
  }
  else if ((bVar1) && (rhs_storage == StorageClassWorkgroup)) {
    local_b8 = "FromThreadGroupToStack";
  }
  else if ((lhs_storage == StorageClassWorkgroup) && (rhs_storage == StorageClassWorkgroup)) {
    local_b8 = "FromThreadGroupToThreadGroup";
  }
  else if ((lhs_storage == StorageBuffer) && (rhs_storage == StorageBuffer)) {
    local_b8 = "FromDeviceToDevice";
  }
  else if ((lhs_storage == StorageBuffer) && ((tag._7_1_ & 1) != 0)) {
    local_b8 = "FromConstantToDevice";
  }
  else if ((lhs_storage == StorageBuffer) && (rhs_storage == StorageClassWorkgroup)) {
    local_b8 = "FromThreadGroupToDevice";
  }
  else if ((lhs_storage == StorageBuffer) && (bVar2)) {
    local_b8 = "FromStackToDevice";
  }
  else if ((lhs_storage == StorageClassWorkgroup) && (rhs_storage == StorageBuffer)) {
    local_b8 = "FromDeviceToThreadGroup";
  }
  else {
    if ((!bVar1) || (rhs_storage != StorageBuffer)) {
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(this_00,"Unknown storage class used for copying arrays.");
      __cxa_throw(this_00,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
    local_b8 = "FromDeviceToStack";
  }
  if (((local_139) && (local_149)) && (((this->msl_options).force_native_arrays & 1U) == 0)) {
    CompilerGLSL::to_expression_abi_cxx11_(&local_d8,&this->super_CompilerGLSL,rhs_id,true);
    CompilerGLSL::
    statement<char_const(&)[13],char_const*&,char_const(&)[2],std::__cxx11::string&,char_const(&)[12],std::__cxx11::string,char_const(&)[12]>
              (&this->super_CompilerGLSL,(char (*) [13])0x59f77b,&local_b8,(char (*) [2])0x5ac375,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68,
               (char (*) [12])".elements, ",&local_d8,(char (*) [12])".elements);");
    ::std::__cxx11::string::~string((string *)&local_d8);
  }
  if ((local_139) && (((this->msl_options).force_native_arrays & 1U) == 0)) {
    CompilerGLSL::to_expression_abi_cxx11_(&local_f8,&this->super_CompilerGLSL,rhs_id,true);
    CompilerGLSL::
    statement<char_const(&)[13],char_const*&,char_const(&)[2],std::__cxx11::string&,char_const(&)[12],std::__cxx11::string,char_const(&)[3]>
              (&this->super_CompilerGLSL,(char (*) [13])0x59f77b,&local_b8,(char (*) [2])0x5ac375,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68,
               (char (*) [12])".elements, ",&local_f8,(char (*) [3])0x5b6d88);
    ::std::__cxx11::string::~string((string *)&local_f8);
  }
  else if ((local_149) && (((this->msl_options).force_native_arrays & 1U) == 0)) {
    CompilerGLSL::to_expression_abi_cxx11_(&local_118,&this->super_CompilerGLSL,rhs_id,true);
    CompilerGLSL::
    statement<char_const(&)[13],char_const*&,char_const(&)[2],std::__cxx11::string&,char_const(&)[3],std::__cxx11::string,char_const(&)[12]>
              (&this->super_CompilerGLSL,(char (*) [13])0x59f77b,&local_b8,(char (*) [2])0x5ac375,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68,
               (char (*) [3])0x5a8753,&local_118,(char (*) [12])".elements);");
    ::std::__cxx11::string::~string((string *)&local_118);
  }
  else {
    CompilerGLSL::to_expression_abi_cxx11_(&local_138,&this->super_CompilerGLSL,rhs_id,true);
    CompilerGLSL::
    statement<char_const(&)[13],char_const*&,char_const(&)[2],std::__cxx11::string&,char_const(&)[3],std::__cxx11::string,char_const(&)[3]>
              (&this->super_CompilerGLSL,(char (*) [13])0x59f77b,&local_b8,(char (*) [2])0x5ac375,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68,
               (char (*) [3])0x5a8753,&local_138,(char (*) [3])0x5b6d88);
    ::std::__cxx11::string::~string((string *)&local_138);
  }
  ::std::__cxx11::string::~string((string *)local_68);
  return true;
}

Assistant:

bool CompilerMSL::emit_array_copy(const char *expr, uint32_t lhs_id, uint32_t rhs_id,
								  StorageClass lhs_storage, StorageClass rhs_storage)
{
	// Allow Metal to use the array<T> template to make arrays a value type.
	// This, however, cannot be used for threadgroup address specifiers, so consider the custom array copy as fallback.
	bool lhs_is_thread_storage = storage_class_array_is_thread(lhs_storage);
	bool rhs_is_thread_storage = storage_class_array_is_thread(rhs_storage);

	bool lhs_is_array_template = lhs_is_thread_storage || lhs_storage == StorageClassWorkgroup;
	bool rhs_is_array_template = rhs_is_thread_storage || rhs_storage == StorageClassWorkgroup;

	// Special considerations for stage IO variables.
	// If the variable is actually backed by non-user visible device storage, we use array templates for those.
	//
	// Another special consideration is given to thread local variables which happen to have Offset decorations
	// applied to them. Block-like types do not use array templates, so we need to force POD path if we detect
	// these scenarios. This check isn't perfect since it would be technically possible to mix and match these things,
	// and for a fully correct solution we might have to track array template state through access chains as well,
	// but for all reasonable use cases, this should suffice.
	// This special case should also only apply to Function/Private storage classes.
	// We should not check backing variable for temporaries.
	auto *lhs_var = maybe_get_backing_variable(lhs_id);
	if (lhs_var && lhs_storage == StorageClassStorageBuffer && storage_class_array_is_thread(lhs_var->storage))
		lhs_is_array_template = true;
	else if (lhs_var && lhs_storage != StorageClassGeneric && type_is_block_like(get<SPIRType>(lhs_var->basetype)))
		lhs_is_array_template = false;

	auto *rhs_var = maybe_get_backing_variable(rhs_id);
	if (rhs_var && rhs_storage == StorageClassStorageBuffer && storage_class_array_is_thread(rhs_var->storage))
		rhs_is_array_template = true;
	else if (rhs_var && rhs_storage != StorageClassGeneric && type_is_block_like(get<SPIRType>(rhs_var->basetype)))
		rhs_is_array_template = false;

	// If threadgroup storage qualifiers are *not* used:
	// Avoid spvCopy* wrapper functions; Otherwise, spvUnsafeArray<> template cannot be used with that storage qualifier.
	if (lhs_is_array_template && rhs_is_array_template && !using_builtin_array())
	{
		// Fall back to normal copy path.
		return false;
	}
	else
	{
		// Ensure the LHS variable has been declared
		if (lhs_var)
			flush_variable_declaration(lhs_var->self);

		string lhs;
		if (expr)
			lhs = expr;
		else
			lhs = to_expression(lhs_id);

		// Assignment from an array initializer is fine.
		auto &type = expression_type(rhs_id);
		auto *var = maybe_get_backing_variable(rhs_id);

		// Unfortunately, we cannot template on address space in MSL,
		// so explicit address space redirection it is ...
		bool is_constant = false;
		if (ir.ids[rhs_id].get_type() == TypeConstant)
		{
			is_constant = true;
		}
		else if (var && var->remapped_variable && var->statically_assigned &&
		         ir.ids[var->static_expression].get_type() == TypeConstant)
		{
			is_constant = true;
		}
		else if (rhs_storage == StorageClassUniform || rhs_storage == StorageClassUniformConstant)
		{
			is_constant = true;
		}

		// For the case where we have OpLoad triggering an array copy,
		// we cannot easily detect this case ahead of time since it's
		// context dependent. We might have to force a recompile here
		// if this is the only use of array copies in our shader.
		add_spv_func_and_recompile(type.array.size() > 1 ? SPVFuncImplArrayCopyMultidim : SPVFuncImplArrayCopy);

		const char *tag = nullptr;
		if (lhs_is_thread_storage && is_constant)
			tag = "FromConstantToStack";
		else if (lhs_storage == StorageClassWorkgroup && is_constant)
			tag = "FromConstantToThreadGroup";
		else if (lhs_is_thread_storage && rhs_is_thread_storage)
			tag = "FromStackToStack";
		else if (lhs_storage == StorageClassWorkgroup && rhs_is_thread_storage)
			tag = "FromStackToThreadGroup";
		else if (lhs_is_thread_storage && rhs_storage == StorageClassWorkgroup)
			tag = "FromThreadGroupToStack";
		else if (lhs_storage == StorageClassWorkgroup && rhs_storage == StorageClassWorkgroup)
			tag = "FromThreadGroupToThreadGroup";
		else if (lhs_storage == StorageClassStorageBuffer && rhs_storage == StorageClassStorageBuffer)
			tag = "FromDeviceToDevice";
		else if (lhs_storage == StorageClassStorageBuffer && is_constant)
			tag = "FromConstantToDevice";
		else if (lhs_storage == StorageClassStorageBuffer && rhs_storage == StorageClassWorkgroup)
			tag = "FromThreadGroupToDevice";
		else if (lhs_storage == StorageClassStorageBuffer && rhs_is_thread_storage)
			tag = "FromStackToDevice";
		else if (lhs_storage == StorageClassWorkgroup && rhs_storage == StorageClassStorageBuffer)
			tag = "FromDeviceToThreadGroup";
		else if (lhs_is_thread_storage && rhs_storage == StorageClassStorageBuffer)
			tag = "FromDeviceToStack";
		else
			SPIRV_CROSS_THROW("Unknown storage class used for copying arrays.");

		// Pass internal array of spvUnsafeArray<> into wrapper functions
		if (lhs_is_array_template && rhs_is_array_template && !msl_options.force_native_arrays)
			statement("spvArrayCopy", tag, "(", lhs, ".elements, ", to_expression(rhs_id), ".elements);");
		if (lhs_is_array_template && !msl_options.force_native_arrays)
			statement("spvArrayCopy", tag, "(", lhs, ".elements, ", to_expression(rhs_id), ");");
		else if (rhs_is_array_template && !msl_options.force_native_arrays)
			statement("spvArrayCopy", tag, "(", lhs, ", ", to_expression(rhs_id), ".elements);");
		else
			statement("spvArrayCopy", tag, "(", lhs, ", ", to_expression(rhs_id), ");");
	}

	return true;
}